

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void move_suite::move_real(void)

{
  undefined1 *puVar1;
  basic_variable<std::allocator<char>_> *this;
  undefined1 local_1a8 [29];
  undefined1 local_18b;
  undefined1 local_18a [2];
  undefined1 local_188 [8];
  variable copy_2;
  variable data_2;
  longdouble value_2;
  undefined1 local_10b;
  undefined1 local_10a [2];
  undefined1 local_108 [8];
  variable copy_1;
  variable data_1;
  undefined8 local_a0;
  double value_1;
  undefined1 local_7b;
  undefined1 local_7a [2];
  undefined1 local_78 [8];
  variable copy;
  variable data;
  undefined4 local_c [2];
  float value;
  
  local_c[0] = 0x40400000;
  puVar1 = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)puVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_7a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_78);
  local_7b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x769,"void move_suite::move_real()",local_7a,&local_7b);
  value_1._4_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                 ((basic_variable<std::allocator<char>_> *)local_78);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("copy.value<float>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x76a,"void move_suite::move_real()",(long)&value_1 + 4,local_c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  local_a0 = 0x4008000000000000;
  puVar1 = &copy_1.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)puVar1,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_10a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_108);
  local_10b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x770,"void move_suite::move_real()",local_10a,&local_10b);
  register0x00001200 =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                 ((basic_variable<std::allocator<char>_> *)local_108);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("copy.value<double>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x771,"void move_suite::move_real()",(long)&value_2 + 8,&local_a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_1.storage.field_0x28);
  register0x00001100 = (longdouble)3.0;
  puVar1 = &copy_2.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)puVar1,register0x00001100);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_18a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_188);
  local_18b = 1;
  this = (basic_variable<std::allocator<char>_> *)0x184318;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x777,"void move_suite::move_real()",local_18a,&local_18b);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_188,this);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("copy.value<long double>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x778,"void move_suite::move_real()",local_1a8,&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_2.storage.field_0x28);
  return;
}

Assistant:

void move_real()
{
    {
        float value = 3.0f;
        variable data(value);
        variable copy(std::move(data));
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<float>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<float>(), value);
    }
    {
        double value = 3.0;
        variable data(value);
        variable copy(std::move(data));
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<double>(), value);
    }
    {
        long double value = 3.0L;
        variable data(value);
        variable copy(std::move(data));
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<long double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<long double>(), value);
    }
}